

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O3

void __thiscall bssl::Vector<NotDefaultConstructible>::clear(Vector<NotDefaultConstructible> *this)

{
  Array<int> *this_00;
  size_t sVar1;
  
  this_00 = &this->data_->array;
  sVar1 = this->size_;
  if (sVar1 != 0) {
    do {
      Array<int>::~Array(this_00);
      this_00 = this_00 + 1;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
    this_00 = &this->data_->array;
  }
  OPENSSL_free(this_00);
  this->data_ = (NotDefaultConstructible *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  return;
}

Assistant:

void clear() {
    std::destroy_n(data_, size_);
    OPENSSL_free(data_);
    data_ = nullptr;
    size_ = 0;
    capacity_ = 0;
  }